

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDepthStencilClearTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::DepthStencilClearTests::init
          (DepthStencilClearTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  DepthStencilClearCase *pDVar1;
  
  pDVar1 = (DepthStencilClearCase *)operator_new(0x90);
  DepthStencilClearCase::DepthStencilClearCase
            (pDVar1,(this->super_TestCaseGroup).m_context,"depth",
             glcts::fixed_sample_locations_values + 1,4,2,true,false,false,false);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pDVar1);
  pDVar1 = (DepthStencilClearCase *)operator_new(0x90);
  DepthStencilClearCase::DepthStencilClearCase
            (pDVar1,(this->super_TestCaseGroup).m_context,"depth_scissored",
             glcts::fixed_sample_locations_values + 1,4,0x10,true,false,true,false);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pDVar1);
  pDVar1 = (DepthStencilClearCase *)operator_new(0x90);
  DepthStencilClearCase::DepthStencilClearCase
            (pDVar1,(this->super_TestCaseGroup).m_context,"depth_scissored_masked",
             glcts::fixed_sample_locations_values + 1,4,0x10,true,false,true,true);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pDVar1);
  pDVar1 = (DepthStencilClearCase *)operator_new(0x90);
  DepthStencilClearCase::DepthStencilClearCase
            (pDVar1,(this->super_TestCaseGroup).m_context,"stencil",
             glcts::fixed_sample_locations_values + 1,4,2,false,true,false,false);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pDVar1);
  pDVar1 = (DepthStencilClearCase *)operator_new(0x90);
  DepthStencilClearCase::DepthStencilClearCase
            (pDVar1,(this->super_TestCaseGroup).m_context,"stencil_masked",
             glcts::fixed_sample_locations_values + 1,4,8,false,true,false,true);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pDVar1);
  pDVar1 = (DepthStencilClearCase *)operator_new(0x90);
  DepthStencilClearCase::DepthStencilClearCase
            (pDVar1,(this->super_TestCaseGroup).m_context,"stencil_scissored",
             glcts::fixed_sample_locations_values + 1,4,0x10,false,true,true,false);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pDVar1);
  pDVar1 = (DepthStencilClearCase *)operator_new(0x90);
  DepthStencilClearCase::DepthStencilClearCase
            (pDVar1,(this->super_TestCaseGroup).m_context,"stencil_scissored_masked",
             glcts::fixed_sample_locations_values + 1,4,0x10,false,true,true,true);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pDVar1);
  pDVar1 = (DepthStencilClearCase *)operator_new(0x90);
  DepthStencilClearCase::DepthStencilClearCase
            (pDVar1,(this->super_TestCaseGroup).m_context,"depth_stencil",
             glcts::fixed_sample_locations_values + 1,4,2,true,true,false,false);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pDVar1);
  pDVar1 = (DepthStencilClearCase *)operator_new(0x90);
  DepthStencilClearCase::DepthStencilClearCase
            (pDVar1,(this->super_TestCaseGroup).m_context,"depth_stencil_masked",
             glcts::fixed_sample_locations_values + 1,4,8,true,true,false,true);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pDVar1);
  pDVar1 = (DepthStencilClearCase *)operator_new(0x90);
  DepthStencilClearCase::DepthStencilClearCase
            (pDVar1,(this->super_TestCaseGroup).m_context,"depth_stencil_scissored",
             glcts::fixed_sample_locations_values + 1,4,0x10,true,true,true,false);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pDVar1);
  pDVar1 = (DepthStencilClearCase *)operator_new(0x90);
  DepthStencilClearCase::DepthStencilClearCase
            (pDVar1,(this->super_TestCaseGroup).m_context,"depth_stencil_scissored_masked",
             glcts::fixed_sample_locations_values + 1,4,0x10,true,true,true,true);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pDVar1);
  return extraout_EAX;
}

Assistant:

void DepthStencilClearTests::init (void)
{
	//																					iters	clears	depth	stencil	scissor	masked
	addChild(new DepthStencilClearCase(m_context, "depth",							"",	4,		2,		true,	false,	false,	false));
	addChild(new DepthStencilClearCase(m_context, "depth_scissored",				"",	4,		16,		true,	false,	true,	false));
	addChild(new DepthStencilClearCase(m_context, "depth_scissored_masked",			"",	4,		16,		true,	false,	true,	true));

	addChild(new DepthStencilClearCase(m_context, "stencil",						"",	4,		2,		false,	true,	false,	false));
	addChild(new DepthStencilClearCase(m_context, "stencil_masked",					"",	4,		8,		false,	true,	false,	true));
	addChild(new DepthStencilClearCase(m_context, "stencil_scissored",				"",	4,		16,		false,	true,	true,	false));
	addChild(new DepthStencilClearCase(m_context, "stencil_scissored_masked",		"",	4,		16,		false,	true,	true,	true));

	addChild(new DepthStencilClearCase(m_context, "depth_stencil",					"",	4,		2,		true,	true,	false,	false));
	addChild(new DepthStencilClearCase(m_context, "depth_stencil_masked",			"",	4,		8,		true,	true,	false,	true));
	addChild(new DepthStencilClearCase(m_context, "depth_stencil_scissored",		"",	4,		16,		true,	true,	true,	false));
	addChild(new DepthStencilClearCase(m_context, "depth_stencil_scissored_masked",	"",	4,		16,		true,	true,	true,	true));
}